

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int exectue_ins(void)

{
  uint uVar1;
  int ins_len;
  undefined4 *puVar2;
  
  ins_len = get_ins_len(code_ptr[registe_ptr->IP],code_ptr[registe_ptr->IP + 1]);
  if (0 < ins_len) {
    uVar1 = registe_ptr->IP;
    if ((registe_ptr->R6 == uVar1) || (registe_ptr->R7 == uVar1)) {
      lvm_debug(ins_len);
    }
    else {
      do_ins();
    }
    if (uVar1 == registe_ptr->IP) {
      registe_ptr->IP = uVar1 + ins_len;
    }
    else if ((debug_flag == true) && (registe_ptr->flag[0xf] != '\0')) {
      registe_ptr->R6 = registe_ptr->IP;
    }
    return 1;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xf6;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

int exectue_ins() {
	int ins_len;
	ins_len=get_ins_len(code_ptr[registe_ptr->IP], code_ptr[registe_ptr->IP + 1]);//获取指令长度 为地址指针递增做准备
	unsigned tempIP = registe_ptr->IP;
	if (ins_len > 0)
	{
		if (registe_ptr->R6 == registe_ptr->IP || registe_ptr->R7 == registe_ptr->IP)//陷入调试状态
		{
			lvm_debug(ins_len);
		}
		else do_ins();
	}
	else throw(LVM_EXECUTE_ERROR);
	if (tempIP == registe_ptr->IP)//检查是否发生跳转
	{
		registe_ptr->IP += ins_len;
	}
	else
	{
		if (debug_flag && registe_ptr->flag[15]) registe_ptr->R6 = registe_ptr->IP;
	}
		
	
	return LVM_SUCCESS;
}